

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_handshake_record
              (ptls_t *tls,
              _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
              *cb,ptls_message_emitter_t *emitter,st_ptls_record_t *rec,
              ptls_handshake_properties_t *properties)

{
  ptls_buffer_t *buf;
  int iVar1;
  uint8_t *__src;
  size_t delta;
  size_t sVar2;
  st_ptls_traffic_protection_t *psVar3;
  uint8_t *puVar4;
  ptls_iovec_t message;
  
  if ((tls->field_0x160 & 0x20) != 0) {
    __src = (tls->recvbuf).mess.base;
    delta = (tls->recvbuf).mess.off;
    puVar4 = __src + delta;
    sVar2 = 0;
    goto LAB_0011103c;
  }
  if (*(char *)&emitter->buf == '\x16') {
    if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
      __src = (uint8_t *)emitter->record_header_length;
      psVar3 = emitter->enc;
    }
    else {
      iVar1 = ptls_buffer_reserve(&(tls->recvbuf).mess,(size_t)emitter->enc);
      if (iVar1 != 0) {
        return iVar1;
      }
      memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,
             (void *)emitter->record_header_length,(size_t)emitter->enc);
      psVar3 = (st_ptls_traffic_protection_t *)(emitter->enc->secret + (tls->recvbuf).mess.off);
      __src = (tls->recvbuf).mess.base;
      (tls->recvbuf).mess.off = (size_t)psVar3;
    }
    puVar4 = __src + (long)psVar3->secret;
    iVar1 = 0x202;
    for (; (delta = (long)puVar4 - (long)__src, 3 < (long)delta &&
           (sVar2 = (ulong)((uint)__src[2] << 8 | (uint)__src[1] << 0x10) + (ulong)__src[3] + 4,
           sVar2 <= delta)); __src = __src + sVar2) {
LAB_0011103c:
      message.len = sVar2;
      message.base = __src;
      iVar1 = handle_handshake_message
                        (tls,(ptls_message_emitter_t *)cb,message,(uint)(delta == sVar2),
                         (ptls_handshake_properties_t *)rec);
      if ((iVar1 != 0x202) && (iVar1 != 0)) goto LAB_001110ac;
      if ((tls->field_0x160 & 0x20) != 0) goto LAB_00111099;
    }
    buf = &(tls->recvbuf).mess;
    if (__src == puVar4) {
LAB_001110ac:
      ptls_buffer_dispose(&(tls->recvbuf).mess);
    }
    else {
      if (buf->base == (uint8_t *)0x0) {
        (tls->recvbuf).mess.base = "";
        (tls->recvbuf).mess.capacity = 0;
        (tls->recvbuf).mess.off = 0;
        (tls->recvbuf).mess.is_allocated = 0;
        iVar1 = ptls_buffer_reserve(buf,delta);
        if (iVar1 != 0) {
          return iVar1;
        }
        memcpy(buf->base,__src,delta);
      }
      else {
        memmove(buf->base,__src,delta);
      }
      (tls->recvbuf).mess.off = delta;
LAB_00111099:
      iVar1 = 0x202;
    }
  }
  else {
    iVar1 = 0x32;
  }
  return iVar1;
}

Assistant:

static int handle_handshake_record(ptls_t *tls,
                                   int (*cb)(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                                             int is_end_of_record, ptls_handshake_properties_t *properties),
                                   ptls_message_emitter_t *emitter, struct st_ptls_record_t *rec,
                                   ptls_handshake_properties_t *properties)
{
    int ret;
    size_t mess_len = 0;
    const uint8_t *src, *src_end;
    if (tls->in_handshake)
    {
        msg("Reenter handle_handshake_record");
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
        goto resume_handshake;
    }
    /* handshake */
    if (rec->type != PTLS_CONTENT_TYPE_HANDSHAKE)
        return PTLS_ALERT_DECODE_ERROR;

    /* flatten the unhandled messages */
    if (tls->recvbuf.mess.base == NULL) {
        src = rec->fragment;
        src_end = src + rec->length;
    } else {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec->length)) != 0)
            return ret;
        memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec->fragment, rec->length);
        tls->recvbuf.mess.off += rec->length;
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
    }

    /* handle the messages */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (src_end - src >= 4) {
        mess_len = 4 + ntoh24(src + 1);
        if (src_end - src < (int)mess_len)
            break;
resume_handshake:
        msg("Calling cb");
        ret = cb(tls, emitter, ptls_iovec_init(src, mess_len), src_end - src == mess_len, properties);
        switch (ret) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            msg("Finished cb, ret: %d, in_handshake: %d", ret, tls->in_handshake);
            if (tls->in_handshake)
                return PTLS_ERROR_IN_PROGRESS;
            break;
        default:
            ptls_buffer_dispose(&tls->recvbuf.mess);
            return ret;
        }
        src += mess_len;
    }

    /* keep last partial message in buffer */
    if (src != src_end) {
        msg("Preserving partial message");
        if (tls->recvbuf.mess.base == NULL) {
            ptls_buffer_init(&tls->recvbuf.mess, "", 0);
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, src_end - src)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base, src, src_end - src);
        } else {
            memmove(tls->recvbuf.mess.base, src, src_end - src);
        }
        tls->recvbuf.mess.off = src_end - src;
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ptls_buffer_dispose(&tls->recvbuf.mess);
    }

    return ret;
}